

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

bool __thiscall flatbuffers::BinaryAnnotator::ContainsSection(BinaryAnnotator *this,uint64_t offset)

{
  uint64_t uVar1;
  iterator iVar2;
  iterator iVar3;
  bool bVar4;
  bool bVar5;
  pointer ppVar6;
  reference pvVar7;
  bool local_49;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  iterator it;
  uint64_t offset_local;
  BinaryAnnotator *this_local;
  
  it._M_node = (_Base_ptr)offset;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
       ::lower_bound(&this->sections_,(key_type *)&it);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
       ::end(&this->sections_);
  bVar4 = std::operator!=(&local_28,&local_30);
  bVar5 = false;
  if (bVar4) {
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>::
             operator->(&local_28);
    bVar5 = (_Base_ptr)ppVar6->first == it._M_node;
  }
  if (bVar5) {
    this_local._7_1_ = true;
  }
  else {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
         ::begin(&this->sections_);
    bVar5 = std::operator==(&local_28,&local_38);
    if (bVar5) {
      this_local._7_1_ = false;
    }
    else {
      std::_Rb_tree_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>::
      operator--(&local_28);
      iVar2 = it;
      ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>::
               operator->(&local_28);
      iVar3 = it;
      local_49 = false;
      if ((_Base_ptr)ppVar6->first <= iVar2._M_node) {
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>
                 ::operator->(&local_28);
        pvVar7 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ::back(&(ppVar6->second).regions);
        uVar1 = pvVar7->offset;
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>
                 ::operator->(&local_28);
        pvVar7 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ::back(&(ppVar6->second).regions);
        local_49 = iVar3._M_node < (_Base_ptr)(uVar1 + pvVar7->length);
      }
      this_local._7_1_ = local_49;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BinaryAnnotator::ContainsSection(const uint64_t offset) {
  auto it = sections_.lower_bound(offset);
  // If the section is found, check that it is exactly equal its offset.
  if (it != sections_.end() && it->first == offset) { return true; }

  // If this was the first section, there are no other previous sections to
  // check.
  if (it == sections_.begin()) { return false; }

  // Go back one section.
  --it;

  // And check that if the offset is covered by the section.
  return offset >= it->first && offset < it->second.regions.back().offset +
                                             it->second.regions.back().length;
}